

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O3

float basisu::gauss(int x,int y,float sigma_sqr)

{
  float fVar1;
  float fVar2;
  
  fVar1 = expf(-(float)(y * y + x * x) / (sigma_sqr + sigma_sqr));
  fVar2 = sigma_sqr * 6.2831855;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  return fVar1 * (1.0 / fVar2);
}

Assistant:

float gauss(int x, int y, float sigma_sqr)
	{
		float pow = expf(-((x * x + y * y) / (2.0f * sigma_sqr)));
		float g = (1.0f / (sqrtf((float)(2.0f * M_PI * sigma_sqr)))) * pow;
		return g;
	}